

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int ARKStepCreateAdjointStepper
              (void *arkode_mem,SUNAdjRhsFn adj_fe,SUNAdjRhsFn adj_fi,sunrealtype tf,N_Vector sf,
              SUNContext_conflict sunctx,SUNAdjointStepper *adj_stepper_ptr)

{
  ARKodeButcherTable Be;
  int iVar1;
  void *arkode_mem_00;
  int line;
  char *msgfmt;
  SUNStepper_conflict adj_stepper;
  sunrealtype local_60;
  SUNStepper_conflict fwd_stepper;
  long nst;
  SUNContext_conflict local_48;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  
  local_60 = tf;
  iVar1 = arkStep_AccessARKODEStepMem(arkode_mem,"ARKStepCreateAdjointStepper",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    local_48 = sunctx;
    iVar1 = arkStepCompatibleWithAdjointSolver
                      (ark_mem,step_mem,0xe17,"ARKStepCreateAdjointStepper",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                      );
    if (iVar1 == 0) {
      if (adj_fi == (SUNAdjRhsFn)0x0) {
        if (adj_fe == (SUNAdjRhsFn)0x0) {
          msgfmt = "adj_fe cannot be NULL.";
          iVar1 = -0x16;
          line = 0xe28;
        }
        else {
          iVar1 = N_VGetVectorID(sf);
          if (iVar1 == 0xd) {
            nst = 0;
            iVar1 = ARKodeGetNumSteps(arkode_mem,&nst);
            if (iVar1 == 0) {
              arkode_mem_00 =
                   ARKStepCreate(arkStep_fe_Adj,(ARKRhsFn)0x0,local_60,sf,ark_mem->sunctx);
              if (arkode_mem_00 == (void *)0x0) {
                msgfmt = "ARKStepCreate returned NULL";
                iVar1 = -0x15;
                line = 0xe44;
              }
              else {
                *(SUNAdjRhsFn *)(*(long *)((long)arkode_mem_00 + 0x88) + 0x28) = adj_fe;
                *(undefined4 *)((long)arkode_mem_00 + 0x410) = 1;
                iVar1 = ARKodeSetFixedStep(arkode_mem_00,-ark_mem->h);
                if (iVar1 == 0) {
                  Be = step_mem->Be;
                  iVar1 = ARKStepSetTables(arkode_mem_00,Be->q,Be->p,step_mem->Bi,Be);
                  if (iVar1 == 0) {
                    iVar1 = ARKodeSetMaxNumSteps(arkode_mem_00,nst);
                    if (iVar1 == 0) {
                      iVar1 = ARKodeSetAdjointCheckpointScheme
                                        (arkode_mem_00,ark_mem->checkpoint_scheme);
                      if (iVar1 == 0) {
                        iVar1 = ARKodeCreateSUNStepper(arkode_mem,&fwd_stepper);
                        if (iVar1 == 0) {
                          iVar1 = SUNStepper_SetReInitFn(fwd_stepper,arkStep_SUNStepperReInit);
                          if (iVar1 == 0) {
                            iVar1 = ARKodeCreateSUNStepper(arkode_mem_00,&adj_stepper);
                            if (iVar1 == 0) {
                              iVar1 = SUNStepper_SetReInitFn(adj_stepper,arkStep_SUNStepperReInit);
                              if (iVar1 == 0) {
                                iVar1 = SUNStepper_SetDestroyFn
                                                  (adj_stepper,arkSUNStepperSelfDestruct);
                                if (iVar1 == 0) {
                                  iVar1 = SUNAdjointStepper_Create
                                                    (local_60,fwd_stepper,1,adj_stepper,1,nst + -1,
                                                     sf,ark_mem->checkpoint_scheme,local_48,
                                                     adj_stepper_ptr);
                                  if (iVar1 == 0) {
                                    iVar1 = SUNAdjointStepper_SetUserData
                                                      (*adj_stepper_ptr,ark_mem->user_data);
                                    if (iVar1 == 0) {
                                      iVar1 = ARKodeSetUserData(arkode_mem_00,*adj_stepper_ptr);
                                      if (iVar1 == 0) {
                                        return 0;
                                      }
                                      msgfmt = "ARKodeSetUserData failed";
                                      line = 0xebd;
                                    }
                                    else {
                                      msgfmt = "SUNAdjointStepper_SetUserData failed";
                                      iVar1 = -0x37;
                                      line = 0xeb3;
                                    }
                                  }
                                  else {
                                    msgfmt = "SUNAdjointStepper_Create failed";
                                    iVar1 = -0x37;
                                    line = 0xeaa;
                                  }
                                }
                                else {
                                  msgfmt = "SUNStepper_SetDestroyFn failed";
                                  iVar1 = -0x33;
                                  line = 0xe9e;
                                }
                              }
                              else {
                                msgfmt = "SUNStepper_SetReInitFn failed";
                                iVar1 = -0x33;
                                line = 0xe93;
                              }
                            }
                            else {
                              msgfmt = "ARKodeCreateSUNStepper failed";
                              line = 0xe8a;
                            }
                          }
                          else {
                            msgfmt = "SUNStepper_SetReInitFn failed";
                            iVar1 = -0x33;
                            line = 0xe81;
                          }
                        }
                        else {
                          msgfmt = "ARKodeCreateSUNStepper failed";
                          line = 0xe78;
                        }
                      }
                      else {
                        msgfmt = "ARKodeSetAdjointCheckpointScheme failed";
                        line = 0xe6d;
                      }
                    }
                    else {
                      msgfmt = "ARKodeSetMaxNumSteps failed";
                      line = 0xe64;
                    }
                  }
                  else {
                    msgfmt = "ARKStepSetTables failed";
                    line = 0xe5c;
                  }
                }
                else {
                  msgfmt = "ARKodeSetFixedStep failed";
                  line = 0xe51;
                }
              }
            }
            else {
              msgfmt = "ARKodeGetNumSteps failed";
              line = 0xe3b;
            }
          }
          else {
            msgfmt = "Incompatible vector type provided for adjoint calculation";
            iVar1 = -0x16;
            line = 0xe2f;
          }
        }
      }
      else {
        msgfmt = "Implicit methods are not yet supported by the adjoint stepper.";
        iVar1 = -0x16;
        line = 0xe21;
      }
    }
    else {
      msgfmt = "ark_mem provided is not compatible with adjoint calculation";
      iVar1 = -0x16;
      line = 0xe1a;
    }
  }
  else {
    msgfmt = "The ARKStep memory pointer is NULL";
    ark_mem = (ARKodeMem)0x0;
    iVar1 = -0x16;
    line = 0xe12;
  }
  arkProcessError(ark_mem,iVar1,line,"ARKStepCreateAdjointStepper",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int ARKStepCreateAdjointStepper(void* arkode_mem, SUNAdjRhsFn adj_fe,
                                SUNAdjRhsFn adj_fi, sunrealtype tf, N_Vector sf,
                                SUNContext sunctx,
                                SUNAdjointStepper* adj_stepper_ptr)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval = arkStep_AccessARKODEStepMem(arkode_mem,
                                           "ARKStepCreateAdjointStepper",
                                           &ark_mem, &step_mem);
  if (retval)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The ARKStep memory pointer is NULL");
    return ARK_ILL_INPUT;
  }

  if (arkStepCompatibleWithAdjointSolver(ark_mem, step_mem, __LINE__, __func__,
                                         __FILE__))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "ark_mem provided is not compatible with adjoint calculation");
    return ARK_ILL_INPUT;
  }

  if (adj_fi)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Implicit methods are not yet supported by the adjoint stepper.");
    return ARK_ILL_INPUT;
  }

  if (!adj_fe)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "adj_fe cannot be NULL.");
    return ARK_ILL_INPUT;
  }

  if (N_VGetVectorID(sf) != SUNDIALS_NVEC_MANYVECTOR)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Incompatible vector type provided for adjoint calculation");
    return ARK_ILL_INPUT;
  }

  /**
    Create and configure the ARKStep stepper for the adjoint system
  */
  long nst = 0;
  retval   = ARKodeGetNumSteps(arkode_mem, &nst);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeGetNumSteps failed");
    return retval;
  }

  void* arkode_mem_adj = ARKStepCreate(arkStep_fe_Adj, NULL, tf, sf,
                                       ark_mem->sunctx);
  if (!arkode_mem_adj)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "ARKStepCreate returned NULL");
    return ARK_MEM_NULL;
  }
  ARKodeMem ark_mem_adj         = (ARKodeMem)arkode_mem_adj;
  ARKodeARKStepMem step_mem_adj = (ARKodeARKStepMem)ark_mem_adj->step_mem;

  step_mem_adj->adj_fe    = adj_fe;
  ark_mem_adj->do_adjoint = SUNTRUE;

  retval = ARKodeSetFixedStep(arkode_mem_adj, -ark_mem->h);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeSetFixedStep failed");
    return retval;
  }

  /* TODO(CJB): when we add support for implicit methods, we should call ARKodeSetLinear here. */

  retval = ARKStepSetTables(arkode_mem_adj, step_mem->Be->q, step_mem->Be->p,
                            step_mem->Bi, step_mem->Be);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKStepSetTables failed");
    return retval;
  }

  retval = ARKodeSetMaxNumSteps(arkode_mem_adj, nst);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeSetMaxNumSteps failed");
    return retval;
  }

  retval = ARKodeSetAdjointCheckpointScheme(arkode_mem_adj,
                                            ark_mem->checkpoint_scheme);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeSetAdjointCheckpointScheme failed");
    return retval;
  }

  SUNErrCode errcode = SUN_SUCCESS;

  SUNStepper fwd_stepper;
  retval = ARKodeCreateSUNStepper(arkode_mem, &fwd_stepper);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeCreateSUNStepper failed");
    return retval;
  }

  errcode = SUNStepper_SetReInitFn(fwd_stepper, arkStep_SUNStepperReInit);
  if (errcode)
  {
    retval = ARK_SUNSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNStepper_SetReInitFn failed");
    return retval;
  }

  SUNStepper adj_stepper;
  retval = ARKodeCreateSUNStepper(arkode_mem_adj, &adj_stepper);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeCreateSUNStepper failed");
    return retval;
  }

  errcode = SUNStepper_SetReInitFn(adj_stepper, arkStep_SUNStepperReInit);
  if (errcode)
  {
    retval = ARK_SUNSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNStepper_SetReInitFn failed");
    return retval;
  }

  /* Setting this ensures that the ARKodeMem underneath the adj_stepper
     is destroyed with the SUNStepper_Destroy call. */
  errcode = SUNStepper_SetDestroyFn(adj_stepper, arkSUNStepperSelfDestruct);
  if (errcode)
  {
    retval = ARK_SUNSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNStepper_SetDestroyFn failed");
    return retval;
  }

  /* SUNAdjointStepper will own the SUNSteppers and destroy them */
  errcode = SUNAdjointStepper_Create(fwd_stepper, SUNTRUE, adj_stepper, SUNTRUE,
                                     nst - 1, tf, sf, ark_mem->checkpoint_scheme,
                                     sunctx, adj_stepper_ptr);
  if (errcode)
  {
    retval = ARK_SUNADJSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNAdjointStepper_Create failed");
    return retval;
  }

  errcode = SUNAdjointStepper_SetUserData(*adj_stepper_ptr, ark_mem->user_data);
  if (errcode)
  {
    retval = ARK_SUNADJSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNAdjointStepper_SetUserData failed");
    return retval;
  }

  /* We need access to the adjoint solver to access the parameter Jacobian inside of ARKStep's
     backwards integration of the the adjoint problem. */
  retval = ARKodeSetUserData(arkode_mem_adj, *adj_stepper_ptr);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeSetUserData failed");
    return retval;
  }

  return ARK_SUCCESS;
}